

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHash.h
# Opt level: O3

int Hash_Int2ManInsert(Hash_IntMan_t *p,int iData0,int iData1,int iData2)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  uint uVar13;
  ulong uVar14;
  
  iVar9 = p->vObjs->nSize;
  iVar7 = iVar9 + 3;
  if (-1 < iVar9) {
    iVar7 = iVar9;
  }
  pVVar12 = p->vTable;
  uVar6 = iVar7 >> 2;
  if (pVVar12->nSize < (int)uVar6) {
    uVar10 = (ulong)(pVVar12->nSize * 2 - 1);
    while( true ) {
      do {
        uVar1 = (uint)uVar10;
        uVar13 = uVar1 + 1;
        uVar14 = (ulong)uVar13;
        uVar11 = uVar10 & 1;
        uVar10 = uVar14;
      } while (uVar11 != 0);
      if (uVar13 < 9) break;
      iVar7 = 5;
      while (uVar13 % (iVar7 - 2U) != 0) {
        uVar3 = iVar7 * iVar7;
        iVar7 = iVar7 + 2;
        if (uVar13 < uVar3) goto LAB_0070baf1;
      }
    }
LAB_0070baf1:
    if (pVVar12->nCap < (int)uVar13) {
      if (pVVar12->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar13 << 2);
      }
      else {
        piVar4 = (int *)realloc(pVVar12->pArray,(long)(int)uVar13 << 2);
      }
      pVVar12->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar12->nCap = uVar13;
    }
    if (uVar1 < 0x7fffffff) {
      memset(pVVar12->pArray,0,uVar14 << 2);
    }
    pVVar12->nSize = uVar13;
    if (iVar9 < 8) {
      pVVar12 = p->vTable;
    }
    else {
      pVVar2 = p->vObjs;
      uVar10 = 2;
      if (2 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      uVar11 = 1;
      do {
        uVar1 = pVVar2->nSize;
        if ((long)(int)uVar1 <= (long)(uVar11 * 4)) goto LAB_0070bcd0;
        piVar4 = pVVar2->pArray;
        piVar4[uVar11 * 4 + 3] = 0;
        pVVar12 = p->vTable;
        uVar14 = (ulong)(uint)(piVar4[uVar11 * 4 + 1] * 0x1ec1 + piVar4[uVar11 * 4] * 0x1051) %
                 (ulong)(uint)pVVar12->nSize;
        if (((int)uVar14 < 0) || (pVVar12->nSize <= (int)uVar14)) goto LAB_0070bcd0;
        iVar9 = pVVar12->pArray[uVar14];
        if (iVar9 == 0) {
          piVar5 = pVVar12->pArray + uVar14;
        }
        else {
          do {
            if ((iVar9 < 0) ||
               (uVar13 = iVar9 * 4,
               uVar1 == uVar13 || SBORROW4(uVar1,uVar13) != (int)(uVar1 + iVar9 * -4) < 0))
            goto LAB_0070bcd0;
            piVar5 = piVar4 + uVar13;
            if ((*piVar5 == piVar4[uVar11 * 4]) && (piVar5[1] == piVar4[uVar11 * 4 + 1])) {
              __assert_fail("*pPlace == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecHash.h"
                            ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
            }
            iVar9 = piVar5[3];
          } while (iVar9 != 0);
          piVar5 = piVar5 + 3;
        }
        *piVar5 = (int)uVar11;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  uVar10 = (ulong)(uint)(iData1 * 0x1ec1 + iData0 * 0x1051) % (ulong)(uint)pVVar12->nSize;
  if ((-1 < (int)uVar10) && ((int)uVar10 < pVVar12->nSize)) {
    iVar9 = pVVar12->pArray[uVar10];
    pVVar2 = p->vObjs;
    if (iVar9 == 0) {
      puVar8 = (uint *)(pVVar12->pArray + uVar10);
    }
    else {
      do {
        if (iVar9 < 0) goto LAB_0070bcd0;
        uVar1 = iVar9 * 4;
        uVar13 = pVVar2->nSize;
        if (uVar13 == uVar1 || SBORROW4(uVar13,uVar1) != (int)(uVar13 + iVar9 * -4) < 0)
        goto LAB_0070bcd0;
        piVar4 = pVVar2->pArray + uVar1;
        if ((*piVar4 == iData0) && (piVar4[1] == iData1)) {
          return iVar9;
        }
        iVar9 = piVar4[3];
      } while (iVar9 != 0);
      puVar8 = (uint *)(piVar4 + 3);
    }
    *puVar8 = uVar6;
    Vec_IntPush(pVVar2,iData0);
    Vec_IntPush(p->vObjs,iData1);
    Vec_IntPush(p->vObjs,0);
    Vec_IntPush(p->vObjs,0);
    return uVar6;
  }
LAB_0070bcd0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int Hash_Int2ManInsert( Hash_IntMan_t * p, int iData0, int iData1, int iData2 )
{
    Hash_IntObj_t * pObj;
    int i, nObjs, * pPlace;
    nObjs = Vec_IntSize(p->vObjs)/4;
    if ( nObjs > Vec_IntSize(p->vTable) )
    {
//        printf( "Resizing...\n" );
        Vec_IntFill( p->vTable, Abc_PrimeCudd(2*Vec_IntSize(p->vTable)), 0 );
        for ( i = 1; i < nObjs; i++ )
        {
            pObj = Hash_IntObj( p, i );
            pObj->iNext = 0;
            pPlace = Hash_Int2ManLookup( p, pObj->iData0, pObj->iData1 );
            assert( *pPlace == 0 );
            *pPlace = i;
        }
    }
    pPlace = Hash_Int2ManLookup( p, iData0, iData1 );
    if ( *pPlace )
        return *pPlace;
    *pPlace = nObjs;
    Vec_IntPush( p->vObjs, iData0 );
    Vec_IntPush( p->vObjs, iData1 );
    Vec_IntPush( p->vObjs, iData2 );
    Vec_IntPush( p->vObjs, 0 );
    return nObjs;
}